

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O2

void __thiscall
mjs::function_object::function_object
          (function_object *this,gc_heap_ptr<mjs::global_object> *global,string *class_name,
          object_ptr *prototype)

{
  void *pvVar1;
  long *plVar2;
  gc_heap_ptr_untyped local_20;
  
  native_object::native_object(&this->super_native_object,class_name,prototype);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_001c3278;
  *(uint32_t *)&(this->super_native_object).field_0x24 = (global->super_gc_heap_ptr_untyped).pos_;
  this->construct_ = 0;
  this->call_ = 0;
  (this->text_).pos_ = 0;
  value_representation::value_representation(&this->prototype_prop_,(value *)value::null);
  this->named_args_ = 0;
  this->is_native_ = false;
  native_object::
  add_native_property<mjs::function_object,_&mjs::function_object::get_length,_nullptr>
            (&this->super_native_object,"length",dont_delete|dont_enum|read_only);
  native_object::
  add_native_property<mjs::function_object,_&mjs::function_object::get_prototype,_&mjs::function_object::put_prototype>
            (&this->super_native_object,"prototype",dont_delete|dont_enum);
  pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  if (*(int *)((long)pvVar1 + 0x20) < 2) {
    plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x98))(&local_20,plVar2,"arguments");
    (*(this->super_native_object).super_object._vptr_object[5])(this,&local_20,value::null,7);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  }
  else {
    pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (**(char **)((long)pvVar1 + 0x28) == '\x01') {
      plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar2 + 0x90))(plVar2,this,"arguments");
      plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar2 + 0x90))(plVar2,this,"caller",*(code **)(*plVar2 + 0x90));
      return;
    }
  }
  return;
}

Assistant:

function_object::function_object(const gc_heap_ptr<global_object>& global, const string& class_name, const object_ptr& prototype)
    : native_object(class_name, prototype)
    , global_(global)
    , prototype_prop_(value_representation{value::null}) {
    DEFINE_NATIVE_PROPERTY_READONLY(function_object, length);
    DEFINE_NATIVE_PROPERTY(function_object, prototype);
    if (global->language_version() < version::es5) {
        object::redefine_own_property(global->common_string("arguments"), value::null, property_attribute::dont_delete|property_attribute::dont_enum|property_attribute::read_only);
    } else {
        if (global->strict_mode()) {
            global->define_thrower_accessor(*this, "arguments");
            global->define_thrower_accessor(*this, "caller");
        }
    }

    static_assert(!gc_type_info_registration<function_object>::needs_destroy);
    static_assert(gc_type_info_registration<function_object>::needs_fixup);
}